

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

void __thiscall Json::StyledWriter::writeCommentAfterValueOnSameLine(StyledWriter *this,Value *root)

{
  bool bVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  bVar1 = Value::hasComment(root,commentAfterOnSameLine);
  if (bVar1) {
    Value::getComment_abi_cxx11_(&local_38,root,commentAfterOnSameLine);
    std::operator+(&bStack_58," ",&local_38);
    std::__cxx11::string::append((string *)&this->document_);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Value::hasComment(root,commentAfter);
  if (bVar1) {
    psVar2 = &this->document_;
    std::__cxx11::string::append((char *)psVar2);
    Value::getComment_abi_cxx11_(&bStack_58,root,commentAfter);
    std::__cxx11::string::append((string *)psVar2);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::append((char *)psVar2);
  }
  return;
}

Assistant:

void StyledWriter::writeCommentAfterValueOnSameLine(const Value& root) {
  if (root.hasComment(commentAfterOnSameLine))
    document_ += " " + root.getComment(commentAfterOnSameLine);

  if (root.hasComment(commentAfter)) {
    document_ += "\n";
    document_ += root.getComment(commentAfter);
    document_ += "\n";
  }
}